

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glCopyTexSubImage2D
          (QOpenGLFunctions *this,GLenum target,GLint level,GLint xoffset,GLint yoffset,GLint x,
          GLint y,GLsizei width,GLsizei height)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  
  (**(code **)(*in_RDI + 0x40))(in_ESI,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008);
  return;
}

Assistant:

inline void QOpenGLFunctions::glCopyTexSubImage2D(GLenum target, GLint level, GLint xoffset, GLint yoffset, GLint x, GLint y, GLsizei width, GLsizei height)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glCopyTexSubImage2D(target, level, xoffset, yoffset, x, y, width, height);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.CopyTexSubImage2D(target, level, xoffset, yoffset, x, y, width, height);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}